

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O1

int UnicodeToUTF8(LPCWSTR lpSrcStr,int cchSrc,LPSTR lpDestStr,int cchDest)

{
  WCHAR WVar1;
  bool bVar2;
  int iVar3;
  WCHAR WVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  iVar6 = cchSrc + -1;
  if ((cchSrc == 0) || (iVar3 = 0, cchDest < 0)) {
    iVar3 = 0;
    WVar4 = L'\0';
  }
  else {
    WVar4 = L'\0';
    iVar7 = iVar6;
    do {
      iVar6 = cchSrc;
      cchSrc = iVar7;
      WVar1 = *lpSrcStr;
      if ((WVar1 & 0xfc00U) == 0xd800) {
        if (cchDest == 0) {
          iVar3 = iVar3 + 3;
        }
        else if (WVar4 != L'\0') {
          iVar7 = iVar3 + 2;
          if (cchDest <= iVar7) break;
          lpDestStr[iVar3] = (byte)((ushort)WVar4 >> 0xc) | 0xe0;
          lpDestStr[iVar3 + 1] = (byte)((ushort)WVar4 >> 6) & 0x3f | 0x80;
          iVar3 = iVar3 + 3;
          lpDestStr[iVar7] = (byte)WVar4 & 0x3f | 0x80;
        }
        WVar4 = *lpSrcStr;
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      if (WVar4 != L'\0' && (WVar1 & 0xfc00U) != 0xd800) {
        WVar1 = *lpSrcStr;
        if (((ushort)WVar1 & 0xfc00) == 0xdc00) {
          if (cchDest == 0) {
            iVar3 = iVar3 + 1;
          }
          else {
            iVar7 = iVar3 + 3;
            if (cchDest <= iVar7) break;
            uVar5 = (uint)(ushort)WVar4 * 0x400 + (uint)(ushort)WVar1 + 0xfca02400;
            lpDestStr[iVar3] = (byte)(uVar5 >> 0x12) | 0xf0;
            lpDestStr[iVar3 + 1] = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
            lpDestStr[iVar3 + 2] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
            iVar3 = iVar3 + 4;
            lpDestStr[iVar7] = (byte)WVar1 & 0x3f | 0x80;
          }
          bVar2 = true;
          WVar4 = L'\0';
        }
        else {
          if (cchDest != 0) {
            iVar7 = iVar3 + 2;
            if (cchDest <= iVar7) break;
            lpDestStr[iVar3] = (byte)((ushort)WVar4 >> 0xc) | 0xe0;
            lpDestStr[iVar3 + 1] = (byte)((ushort)WVar4 >> 6) & 0x3f | 0x80;
            iVar3 = iVar3 + 3;
            lpDestStr[iVar7] = (byte)WVar4 & 0x3f | 0x80;
          }
          WVar4 = L'\0';
          bVar2 = false;
        }
      }
      if (!bVar2) {
        WVar1 = *lpSrcStr;
        if ((ushort)WVar1 < 0x80) {
          if (cchDest != 0) {
            if (cchDest <= iVar3) break;
            lpDestStr[iVar3] = (CHAR)WVar1;
          }
          iVar3 = iVar3 + 1;
        }
        else if ((ushort)WVar1 < 0x800) {
          if (cchDest == 0) {
            iVar3 = iVar3 + 2;
          }
          else {
            iVar7 = iVar3 + 1;
            if (cchDest <= iVar7) break;
            lpDestStr[iVar3] = (byte)((ushort)WVar1 >> 6) | 0xc0;
            iVar3 = iVar3 + 2;
            lpDestStr[iVar7] = (byte)*lpSrcStr & 0x3f | 0x80;
          }
        }
        else if (cchDest == 0) {
          iVar3 = iVar3 + 3;
        }
        else {
          iVar6 = iVar3 + 2;
          if (cchDest <= iVar6) {
            iVar6 = cchSrc + 1;
            break;
          }
          lpDestStr[iVar3] = (byte)((ushort)WVar1 >> 0xc) | 0xe0;
          lpDestStr[iVar3 + 1] = (byte)((ushort)*lpSrcStr >> 6) & 0x3f | 0x80;
          iVar3 = iVar3 + 3;
          lpDestStr[iVar6] = (byte)*lpSrcStr & 0x3f | 0x80;
        }
      }
      iVar6 = cchSrc + -1;
      if (cchSrc == 0) {
        iVar6 = -1;
        break;
      }
      lpSrcStr = lpSrcStr + 1;
      iVar7 = iVar6;
    } while ((cchDest == 0) || (iVar3 < cchDest));
  }
  if (((cchDest != 0) && (iVar6 < 0)) && (WVar4 != L'\0')) {
    iVar7 = iVar3 + 2;
    if (iVar7 < cchDest) {
      lpDestStr[iVar3] = (byte)((ushort)WVar4 >> 0xc) | 0xe0;
      lpDestStr[iVar3 + 1] = (byte)((ushort)WVar4 >> 6) & 0x3f | 0x80;
      iVar3 = iVar3 + 3;
      lpDestStr[iVar7] = (byte)WVar4 & 0x3f | 0x80;
    }
    else {
      iVar6 = iVar6 + 1;
    }
  }
  if ((cchDest != 0) && (-1 < iVar6)) {
    SetLastError(0x7a);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int UnicodeToUTF8(
    LPCWSTR lpSrcStr,
    int cchSrc,
    LPSTR lpDestStr,
    int cchDest)
{
    LPCWSTR lpWC = lpSrcStr;
    int     cchU8 = 0;                // # of UTF8 chars generated
    DWORD   dwSurrogateChar;
    WCHAR   wchHighSurrogate = 0;
    BOOL    bHandled;


    while ((cchSrc--) && ((cchDest == 0) || (cchU8 < cchDest)))
    {
        bHandled = FALSE;

        //
        // Check if high surrogate is available
        //
        if ((*lpWC >= HIGH_SURROGATE_START) && (*lpWC <= HIGH_SURROGATE_END))
        {
            if (cchDest)
            {
                // Another high surrogate, then treat the 1st as normal
                // Unicode character.
                if (wchHighSurrogate)
                {
                    if ((cchU8 + 2) < cchDest)
                    {
                        lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(wchHighSurrogate);
                    }
                    else
                    {
                        // not enough buffer
                        cchSrc++;
                        break;
                    }
                }
            }
            else
            {
                cchU8 += 3;
            }
            wchHighSurrogate = *lpWC;
            bHandled = TRUE;
        }

        if (!bHandled && wchHighSurrogate)
        {
            if ((*lpWC >= LOW_SURROGATE_START) && (*lpWC <= LOW_SURROGATE_END))
            {
                 // wheee, valid surrogate pairs

                 if (cchDest)
                 {
                     if ((cchU8 + 3) < cchDest)
                     {
                         dwSurrogateChar = (((wchHighSurrogate-0xD800) << 10) + (*lpWC - 0xDC00) + 0x10000);

                         lpDestStr[cchU8++] = (UTF8_1ST_OF_4 |
                                               (unsigned char)(dwSurrogateChar >> 18));           // 3 bits from 1st byte

                         lpDestStr[cchU8++] =  (UTF8_TRAIL |
                                                (unsigned char)((dwSurrogateChar >> 12) & 0x3f)); // 6 bits from 2nd byte

                         lpDestStr[cchU8++] = (UTF8_TRAIL |
                                               (unsigned char)((dwSurrogateChar >> 6) & 0x3f));   // 6 bits from 3rd byte

                         lpDestStr[cchU8++] = (UTF8_TRAIL |
                                               (unsigned char)(0x3f & dwSurrogateChar));          // 6 bits from 4th byte
                     }
                     else
                     {
                        // not enough buffer
                        cchSrc++;
                        break;
                     }
                 }
                 else
                 {
                     // we already counted 3 previously (in high surrogate)
                     cchU8 ++;
                 }

                 bHandled = TRUE;
            }
            else
            {
                 // Bad Surrogate pair : ERROR
                 // Just process wchHighSurrogate , and the code below will
                 // process the current code point
                 if (cchDest)
                 {
                     if ((cchU8 + 2) < cchDest)
                     {
                        lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(wchHighSurrogate);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(wchHighSurrogate);
                     }
                     else
                     {
                        // not enough buffer
                        cchSrc++;
                        break;
                     }
                 }
            }

            wchHighSurrogate = 0;
        }

        if (!bHandled)
        {
            if (*lpWC <= ASCII)
            {
                //
                //  Found ASCII.
                //
                if (cchDest)
                {
                    if (cchU8 < cchDest) 
                    {
                        lpDestStr[cchU8] = (char)*lpWC;
                    } 
                    else 
                    {
                        //
                        //  Error - buffer too small.
                        //
                        cchSrc++;
                        break;
                    }
                }
                cchU8++;
            }
            else if (*lpWC <= UTF8_2_MAX)
            {
                //
                //  Found 2 byte sequence if < 0x07ff (11 bits).
                //
                if (cchDest)
                {
                    if ((cchU8 + 1) < cchDest)
                    {
                        //
                        //  Use upper 5 bits in first byte.
                        //  Use lower 6 bits in second byte.
                        //
                        lpDestStr[cchU8++] = UTF8_1ST_OF_2 | (*lpWC >> 6);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(*lpWC);
                    }
                    else
                    {
                        //
                        //  Error - buffer too small.
                        //
                        cchSrc++;
                        break;
                    }
                }
                else
                {
                    cchU8 += 2;
                }
            }
            else
            {
                //
                //  Found 3 byte sequence.
                //
                if (cchDest)
                {
                    if ((cchU8 + 2) < cchDest)
                    {
                        //
                        //  Use upper  4 bits in first byte.
                        //  Use middle 6 bits in second byte.
                        //  Use lower  6 bits in third byte.
                        //
                        lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(*lpWC);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(*lpWC);
                        lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(*lpWC);
                    }
                    else
                    {
                        //
                        //  Error - buffer too small.
                        //
                        cchSrc++;
                        break;
                    }
                }
                else
                {
                    cchU8 += 3;
                }
            }
        }

        lpWC++;
    }

    //
    // If the last character was a high surrogate, then handle it as a normal
    // unicode character.
    //
    if ((cchSrc < 0) && (wchHighSurrogate != 0))
    {
        if (cchDest)
        {
            if ((cchU8 + 2) < cchDest)
            {
                lpDestStr[cchU8++] = UTF8_1ST_OF_3 | HIGHER_6_BIT(wchHighSurrogate);
                lpDestStr[cchU8++] = UTF8_TRAIL    | MIDDLE_6_BIT(wchHighSurrogate);
                lpDestStr[cchU8++] = UTF8_TRAIL    | LOWER_6_BIT(wchHighSurrogate);
            }
            else
            {
                cchSrc++;
            }
        }
    }

    //
    //  Make sure the destination buffer was large enough.
    //
    if (cchDest && (cchSrc >= 0))
    {
        SetLastError(ERROR_INSUFFICIENT_BUFFER);
        return (0);
    }

    //
    //  Return the number of UTF-8 characters written.
    //
    return (cchU8);
}